

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CborMap::Put(Error *__return_storage_ptr__,CborMap *this,int aKey,int aValue)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  string_view fmt;
  format_args args;
  _Bool local_115;
  anon_class_1_0_00000001 local_102;
  v10 local_101;
  v10 *local_100;
  size_t local_f8;
  string local_f0;
  _Bool local_c9;
  cn_cbor *pcStack_c8;
  bool succeed;
  cn_cbor *cborInt;
  int aValue_local;
  int aKey_local;
  CborMap *this_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a8 [2];
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  cborInt._0_4_ = aValue;
  cborInt._4_4_ = aKey;
  _aValue_local = this;
  this_local = (CborMap *)__return_storage_ptr__;
  pcStack_c8 = cn_cbor_int_create((long)aValue,(cn_cbor_errback *)0x0);
  local_115 = false;
  if (pcStack_c8 != (cn_cbor *)0x0) {
    local_115 = cn_cbor_mapput_int((this->super_CborValue).mCbor,(long)cborInt._4_4_,pcStack_c8,
                                   (cn_cbor_errback *)0x0);
  }
  local_c9 = local_115;
  if (local_115 == false) {
    Put::anon_class_1_0_00000001::operator()(&local_102);
    local_58 = &local_100;
    local_60 = &local_101;
    bVar1 = ::fmt::v10::operator()(local_60);
    local_f8 = bVar1.size_;
    local_100 = (v10 *)bVar1.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_78 = local_100;
    sStack_70 = local_f8;
    local_50 = &local_78;
    local_88 = local_100;
    local_80 = local_f8;
    local_68 = &local_f0;
    local_48 = local_88;
    sStack_40 = local_80;
    local_a8[0] = ::fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = local_a8;
    local_18 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_f0,local_88,fmt,args);
    Error::Error(__return_storage_ptr__,kOutOfMemory,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  else {
    Error::Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CborMap::Put(int aKey, int aValue)
{
    cn_cbor *cborInt = cn_cbor_int_create(aValue, nullptr);
    bool     succeed = cborInt && cn_cbor_mapput_int(mCbor, aKey, cborInt, nullptr);
    return succeed ? ERROR_NONE : ERROR_OUT_OF_MEMORY("CBOR map insert integer");
}